

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_walk_node.cpp
# Opt level: O1

void __thiscall random_walk_node::run(random_walk_node *this)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vec3 *pvVar9;
  long lVar10;
  long lVar11;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  long lVar12;
  double dVar13;
  double dVar14;
  
  dVar8 = ZMIN;
  dVar7 = YMIN;
  dVar6 = XMIN;
  dVar5 = VMAX;
  dVar4 = VMIN;
  dVar3 = ZMAX;
  dVar1 = YMAX;
  dVar14 = XMAX;
  dVar13 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).x = (dVar14 - dVar6) * dVar13 + dVar6;
  dVar14 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).y = (dVar1 - dVar7) * dVar14 + dVar7;
  dVar14 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).z = (dVar3 - dVar8) * dVar14 + dVar8;
  dVar14 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).v = dVar14 * (dVar5 - dVar4) + dVar4;
  dVar14 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).d = dVar14 * 6.283185307179586 + 0.0;
  dVar14 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).p = dVar14 * 3.141592653589793 + 0.0;
  *(uint *)(usleep + *(long *)(std::cout + -0x18)) =
       *(uint *)(usleep + *(long *)(std::cout + -0x18)) | 4;
  std::chrono::_V2::system_clock::now();
  lVar10 = std::chrono::_V2::system_clock::now();
  std::chrono::_V2::system_clock::now();
  pvVar9 = points;
  dVar14 = (this->super_node).y;
  dVar1 = (this->super_node).z;
  iVar2 = (this->super_node).id;
  points[iVar2].field_0.x = (float)(this->super_node).x;
  pvVar9[iVar2].field_1.y = (float)dVar14;
  pvVar9[iVar2].field_2.z = (float)dVar1;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  lVar12 = lVar10;
  if (running == true) {
    do {
      std::chrono::_V2::system_clock::now();
      lVar11 = std::chrono::_V2::system_clock::now();
      if ((this->super_node).first == true) {
        (this->super_node).first = false;
        lVar10 = lVar11;
        lVar12 = lVar11;
      }
      update(this,((double)(lVar11 - lVar10) / 1000.0) / 1000000.0);
      lVar10 = std::chrono::_V2::system_clock::now();
      lVar11 = std::chrono::_V2::system_clock::now();
      if (interval * 1000000.0 < (double)(lVar11 - lVar12) / 1000.0) {
        dVar14 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        node::setv(&this->super_node,dVar14 * (dVar5 - dVar4) + dVar4);
        dVar14 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        node::setd(&this->super_node,dVar14 * 6.283185307179586 + 0.0);
        dVar14 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        node::setp(&this->super_node,dVar14 * 3.141592653589793 + 0.0);
        (this->super_node).lastErr = 0;
        lVar12 = lVar11;
      }
      usleep(1000);
    } while (running != false);
  }
  return;
}

Assistant:

void random_walk_node::run(){
    uniform_real_distribution<double> randomX(XMIN,XMAX);
    uniform_real_distribution<double> randomY(YMIN,YMAX);
    uniform_real_distribution<double> randomZ(ZMIN,ZMAX);
    uniform_real_distribution<double> randomVel(VMIN,VMAX);
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    x = randomX(e);
    y = randomY(e);
    z = randomZ(e);
    v = randomVel(e);
    d = randomDir(e);
    p = randomPitch(e);
    std::chrono::duration<double, std::micro> tmpTime;     //Time between current and lastshow
    std::chrono::duration<double, std::micro> loopTime;    //Time used for a single loop
    std::chrono::duration<double, std::micro> changeTime;
    std::chrono::duration<double, std::micro> wholeTime;
    high_resolution_clock::time_point loopEndTime;
    cout<<setiosflags(ios::fixed);
    high_resolution_clock::time_point baseTime = high_resolution_clock::now();
    high_resolution_clock::time_point lastChange = high_resolution_clock::now();    //Time when random_walk_node info changed
    high_resolution_clock::time_point  lastUpdate = lastChange;   //Time when random_walk_node loc updated
    high_resolution_clock::time_point lastShow = lastUpdate;    //Time when random_walk_node info shown
    high_resolution_clock::time_point currentTime = high_resolution_clock::now();
    wholeTime = currentTime-baseTime;
    //printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
    //initial output
    while(running == true){
        currentTime = high_resolution_clock::now();
        tmpTime = (currentTime-lastShow);
        loopEndTime = high_resolution_clock::now();
        if (first) {
            lastUpdate = loopEndTime;
            lastChange = loopEndTime;
            first = false;
        }
        loopTime=(loopEndTime-lastUpdate);
        this->update(loopTime.count()/1e6);
        lastUpdate = high_resolution_clock::now();
        currentTime = high_resolution_clock::now();
        changeTime = currentTime-lastChange;
        if(changeTime.count() > interval*1e6){       //Regenerate random_walk_node info every $timeout second
            lastChange = currentTime;
            this->setv(randomVel(e));
            this->setd(randomDir(e));
            this->setp(randomPitch(e));
            lastErr = 0;                //To avoid random_walk_node bouncing near the edge
        }
        usleep(1000);
    }
}